

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  loc_conflict *plVar1;
  undefined2 uVar2;
  loc lVar3;
  uint uVar4;
  uint32_t uVar5;
  bool bVar6;
  _Bool _Var7;
  ushort uVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  wchar_t wVar12;
  loc_conflict grid;
  monster *pmVar13;
  loc lVar14;
  monster_conflict *mon;
  square *psVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  chunk_conflict *c;
  char *fmt;
  int iVar19;
  loc p;
  wchar_t wVar20;
  ulong uVar21;
  _Bool local_6d;
  uint local_6c;
  uint32_t local_68;
  long local_60;
  
  grid = loc(context->x,context->y);
  uVar4._0_2_ = z_info->dungeon_hgt;
  uVar4._2_2_ = z_info->dungeon_wid;
  if ((ushort)(undefined2)uVar4 < z_info->dungeon_wid) {
    uVar4 = (uint)z_info->dungeon_wid;
  }
  local_6d = true;
  if ((context->origin).what == SRC_MONSTER) {
    local_6d = context->subtype != 0;
  }
  wVar20 = (context->value).base;
  wVar12 = (context->value).m_bonus;
  pmVar13 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  _Var7 = loc_is_zero(grid);
  if (_Var7) {
    if (pmVar13 == (monster *)0x0) {
      if (local_6d != false) {
        lVar14 = cave_find_decoy(cave);
        _Var7 = loc_is_zero((loc_conflict)lVar14);
        if ((!_Var7) && (context->subtype != 0)) {
          square_destroy_decoy(cave,lVar14);
          return true;
        }
        plVar1 = &player->grid;
        grid.y = 0;
        grid.x = plVar1->x;
        lVar14.x = plVar1->x;
        lVar14.y = plVar1->y;
        uVar21 = (ulong)(uint)(player->grid).y;
        _Var7 = square_isno_teleport(cave,lVar14);
        if ((!_Var7) || (wVar20 < L'\v' && wVar20 != L'\0')) {
          _Var7 = player_of_has(player,L'\x19');
          if (!_Var7) goto LAB_0013f92b;
          equip_learn_flag(player,L'\x19');
        }
        fmt = "Teleportation forbidden!";
        goto LAB_0013fb8f;
      }
      if ((context->origin).what != SRC_MONSTER) {
        __assert_fail("context->origin.what == SRC_MONSTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                      ,0xa00,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
      }
      pmVar13 = cave_monster(cave,(context->origin).which.monster);
    }
    grid.y = 0;
    grid.x = (pmVar13->grid).x;
    uVar21 = (ulong)(uint)(pmVar13->grid).y;
  }
  else {
    uVar21 = (ulong)grid >> 0x20;
  }
LAB_0013f92b:
  iVar19 = grid.x;
  if (wVar12 != L'\0') {
    iVar9 = (int)uVar21;
    iVar16 = cave->height - iVar9;
    if (iVar16 < iVar9) {
      iVar16 = iVar9;
    }
    iVar9 = cave->width - iVar19;
    if (iVar9 < iVar19) {
      iVar9 = iVar19;
    }
    if (iVar9 < iVar16) {
      iVar9 = iVar16;
    }
    wVar20 = (iVar9 * wVar12) / 100;
  }
  uVar10 = Rand_div(2);
  wVar12 = wVar20 + L'\x03';
  if (L'\xffffffff' < wVar20) {
    wVar12 = wVar20;
  }
  uVar11 = Rand_div(wVar12 >> 2);
  uVar5 = -uVar11;
  if (uVar10 != 0) {
    uVar5 = uVar11;
  }
  c = cave;
  if (2 < cave->height) {
    local_6c = (uVar4 & 0xffff) * 2;
    bVar6 = true;
    p.x = L'\0';
    p.y = L'\0';
    local_60 = 1;
    local_68 = 0;
    do {
      if (2 < c->width) {
        uVar18 = 1;
        do {
          lVar14 = (loc)(local_60 << 0x20 | uVar18);
          wVar12 = distance((loc_conflict)lVar14,
                            (loc_conflict)((uVar21 << 0x20) + ((ulong)grid & 0xffffffff)));
          uVar17 = wVar12 - (wVar20 + uVar5);
          uVar4 = -uVar17;
          if (0 < (int)uVar17) {
            uVar4 = uVar17;
          }
          if ((wVar12 != L'\0') &&
             (_Var7 = has_teleport_destination_prereqs((chunk *)cave,lVar14,local_6d), _Var7)) {
            _Var7 = square_isvault(cave,lVar14);
            if (_Var7) {
              if (!bVar6) goto LAB_0013faaf;
            }
            else {
              if (bVar6) {
                uVar2 = z_info->dungeon_hgt;
                uVar8 = uVar2;
                if ((ushort)uVar2 < z_info->dungeon_wid) {
                  uVar8 = z_info->dungeon_wid;
                }
                local_6c = (uint)uVar8 * 2;
              }
              bVar6 = false;
            }
            if ((int)uVar4 <= (int)local_6c) {
              lVar14 = (loc)mem_zalloc(0x10);
              *(int *)lVar14 = (int)uVar18;
              *(int *)((long)lVar14 + 4) = (int)local_60;
              if (uVar4 < local_6c) {
                while (p != (loc)0x0) {
                  lVar3 = *(loc *)((long)p + 8);
                  mem_free((void *)p);
                  p = lVar3;
                }
                local_68 = 1;
                p = lVar14;
                local_6c = uVar4;
              }
              else {
                *(loc *)((long)lVar14 + 8) = p;
                local_68 = local_68 + 1;
                p = lVar14;
              }
            }
          }
LAB_0013faaf:
          uVar18 = uVar18 + 1;
          c = cave;
        } while ((long)uVar18 < (long)cave->width + -1);
      }
      local_60 = local_60 + 1;
    } while (local_60 < (long)c->height + -1);
    if (local_68 != 0) {
      uVar10 = Rand_div(local_68);
      for (; uVar10 != 0; uVar10 = uVar10 - 1) {
        lVar14 = *(loc *)((long)p + 8);
        mem_free((void *)p);
        p = lVar14;
      }
      sound((uint)(local_6d ^ 1U) + (uint)(local_6d ^ 1U) * 4 + 10);
      monster_swap((loc)((ulong)grid & 0xffffffff | uVar21 << 0x20),*(loc *)p);
      if (local_6d != false) {
        player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
      }
      psVar15 = square(cave,*(loc *)p);
      flag_off(psVar15->info,3,0x12);
      pmVar13 = target_get_monster();
      _Var7 = target_able(pmVar13);
      if (!_Var7) {
        target_set_monster((monster *)0x0);
      }
      handle_stuff(player);
      do {
        lVar14 = *(loc *)((long)p + 8);
        mem_free((void *)p);
        p = lVar14;
      } while (lVar14 != (loc)0x0);
      return true;
    }
  }
  if (local_6d == false) {
    mon = (monster_conflict *)cave_monster(c,(context->origin).which.monster);
    _Var7 = square_isseen(cave,mon->grid);
    if (!_Var7) {
      return true;
    }
    add_monster_message(mon,L'0',true);
    return true;
  }
  fmt = "Failed to find teleport destination!";
LAB_0013fb8f:
  msg(fmt);
  return true;
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool is_player = (context->origin.what != SRC_MONSTER || context->subtype);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && context->subtype) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}